

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O1

void Msat_SolverPrepare(Msat_Solver_t *p,Msat_IntVec_t *vVars)

{
  long lVar1;
  
  if (0 < p->nVarsAlloc) {
    lVar1 = 0;
    do {
      p->pAssigns[lVar1] = -1;
      p->pReasons[lVar1] = (Msat_Clause_t *)0x0;
      p->pLevel[lVar1] = -1;
      p->pdActivity[lVar1] = 0.0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nVarsAlloc);
  }
  Msat_OrderClean(p->pOrder,vVars);
  Msat_QueueClear(p->pQueue);
  Msat_IntVecClear(p->vTrail);
  Msat_IntVecClear(p->vTrailLim);
  p->dProgress = 0.0;
  return;
}

Assistant:

void Msat_SolverPrepare( Msat_Solver_t * p, Msat_IntVec_t * vVars )
{

    int i;
    // undo the previous data
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pAssigns[i]   = MSAT_VAR_UNASSIGNED;
        p->pReasons[i]   = NULL;
        p->pLevel[i]     = -1;
        p->pdActivity[i] = 0.0;
    }

    // set the new variable order
    Msat_OrderClean( p->pOrder, vVars );

    Msat_QueueClear( p->pQueue );
    Msat_IntVecClear( p->vTrail );
    Msat_IntVecClear( p->vTrailLim );
    p->dProgress = 0.0;
}